

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

float __thiscall r_exec::View::update_sln_delta(View *this)

{
  double dVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = (float)r_code::Atom::asFloat();
  dVar1 = this->initial_sln;
  fVar3 = (float)r_code::Atom::asFloat();
  this->initial_sln = (double)fVar3;
  return (float)((double)fVar2 - dVar1);
}

Assistant:

float View::update_sln_delta()
{
    float delta = get_sln() - initial_sln;
    initial_sln = get_sln();
    return delta;
}